

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::sdiv_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  bool bVar1;
  undefined8 in_RCX;
  APInt AVar2;
  
  bVar1 = isMinSignedValue(RHS);
  if (bVar1) {
    bVar1 = isAllOnesValue((APInt *)Overflow);
  }
  else {
    bVar1 = false;
  }
  *(bool *)in_RCX = bVar1;
  AVar2 = sdiv(this,RHS);
  AVar2.U.pVal = (uint64_t *)this;
  return AVar2;
}

Assistant:

APInt APInt::sdiv_ov(const APInt &RHS, bool &Overflow) const {
  // MININT/-1  -->  overflow.
  Overflow = isMinSignedValue() && RHS.isAllOnesValue();
  return sdiv(RHS);
}